

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O2

void __thiscall sentencepiece::SentencePieceText::SharedDtor(SentencePieceText *this)

{
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->text_,(string *)&google::protobuf::internal::fixed_address_empty_string);
  return;
}

Assistant:

void SentencePieceText::SharedDtor() {
  GOOGLE_DCHECK(GetArena() == nullptr);
  text_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
}